

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O1

ParseStatus ParseVP8X(WebPDemuxer *dmux)

{
  size_t sVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint8_t uVar5;
  ushort uVar6;
  undefined2 uVar7;
  uint32_t uVar8;
  size_t sVar9;
  uint8_t *puVar10;
  size_t sVar11;
  Frame *pFVar12;
  bool bVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  ParseStatus PVar17;
  Frame *frame;
  Chunk *pCVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  MemBuffer_conflict *mem;
  size_t sVar23;
  ParseStatus PVar24;
  ulong uVar25;
  bool bVar26;
  uint uStack_34;
  
  sVar23 = (dmux->mem_).start_;
  sVar9 = (dmux->mem_).end_;
  if (7 < sVar9 - sVar23) {
    dmux->is_ext_format_ = 1;
    (dmux->mem_).start_ = sVar23 + 4;
    puVar10 = (dmux->mem_).buf_;
    uVar15 = (uint)puVar10[sVar23 + 4];
    uVar14 = (uint)puVar10[sVar23 + 6] << 0x10 | (uint)puVar10[sVar23 + 5] << 8 |
             (uint)puVar10[sVar23 + 7] << 0x18;
    sVar1 = sVar23 + 8;
    (dmux->mem_).start_ = sVar1;
    if (uVar15 + uVar14 + 9 < 0x13) {
      return PARSE_ERROR;
    }
    uVar14 = (uVar15 & 1) + (uVar14 | uVar15);
    sVar11 = (dmux->mem_).riff_end_;
    if (sVar11 - sVar1 < (ulong)uVar14) {
      return PARSE_ERROR;
    }
    if ((ulong)uVar14 <= sVar9 - sVar1) {
      dmux->feature_flags_ = (uint)puVar10[sVar23 + 8];
      (dmux->mem_).start_ = sVar23 + 0xc;
      uVar6 = *(ushort *)(puVar10 + sVar23 + 0xc);
      bVar2 = puVar10[sVar23 + 0xe];
      (dmux->mem_).start_ = sVar23 + 0xf;
      uVar15 = (uint)uVar6 + (uint)bVar2 * 0x10000 + 1;
      dmux->canvas_width_ = uVar15;
      uVar6 = *(ushort *)(puVar10 + sVar23 + 0xf);
      bVar2 = puVar10[sVar23 + 0x11];
      (dmux->mem_).start_ = sVar23 + 0x12;
      uVar19 = (uint)bVar2 * 0x10000 + (uint)uVar6 + 1;
      dmux->canvas_height_ = uVar19;
      if ((int)((ulong)uVar15 * (ulong)uVar19 >> 0x20) != 0) {
        return PARSE_ERROR;
      }
      sVar23 = sVar23 + 0x12 + (ulong)(uVar14 - 10);
      (dmux->mem_).start_ = sVar23;
      dmux->state_ = WEBP_DEMUX_PARSED_HEADER;
      if (sVar11 - sVar23 < 8) {
        return PARSE_ERROR;
      }
      if (sVar9 - sVar23 < 8) {
        return PARSE_NEED_MORE_DATA;
      }
      bVar13 = false;
      uStack_34 = dmux->feature_flags_ & 2;
      do {
        sVar9 = (dmux->mem_).start_;
        puVar10 = (dmux->mem_).buf_;
        iVar16 = *(int *)(puVar10 + sVar9);
        (dmux->mem_).start_ = sVar9 + 4;
        bVar2 = puVar10[sVar9 + 4];
        uVar14 = (uint)puVar10[sVar9 + 6] << 0x10 | (uint)puVar10[sVar9 + 5] << 8 |
                 (uint)puVar10[sVar9 + 7] << 0x18 | (uint)bVar2;
        sVar23 = sVar9 + 8;
        (dmux->mem_).start_ = sVar23;
        if (uVar14 < 0xfffffff7) {
          uVar15 = (bVar2 & 1) + uVar14;
          uVar25 = (ulong)uVar15;
          uVar22 = (dmux->mem_).riff_end_ - sVar23;
          if (uVar22 < uVar25) goto LAB_0014f88c;
          frame = (Frame *)0x0;
          if (iVar16 < 0x48504c41) {
            if (iVar16 < 0x46495845) {
              if (iVar16 == 0x20385056) goto LAB_0014fa95;
              bVar26 = false;
              if (iVar16 == 0x20504d58) {
                iVar20 = 2;
                goto LAB_0014facc;
              }
LAB_0014fad6:
              PVar24 = PARSE_NEED_MORE_DATA;
              if (uVar25 <= (dmux->mem_).end_ - sVar23) {
                if (!bVar26) {
                  pCVar18 = (Chunk *)WebPSafeCalloc(1,0x18);
                  if (pCVar18 == (Chunk *)0x0) {
                    iVar16 = 1;
                    PVar24 = PARSE_OK;
                    goto LAB_0014f891;
                  }
                  (pCVar18->data_).offset_ = sVar9;
                  (pCVar18->data_).size_ = (ulong)(uVar14 + 8);
                  *dmux->chunks_tail_ = pCVar18;
                  pCVar18->next_ = (Chunk *)0x0;
                  dmux->chunks_tail_ = &pCVar18->next_;
                }
                (dmux->mem_).start_ = (dmux->mem_).start_ + uVar25;
                goto LAB_0014fb39;
              }
            }
            else {
              if (iVar16 == 0x46495845) {
                iVar20 = 3;
LAB_0014facc:
                bVar26 = (dmux->feature_flags_ >> iVar20 & 1) == 0;
                goto LAB_0014fad6;
              }
              bVar26 = false;
              if (iVar16 != 0x464d4e41) goto LAB_0014fad6;
              if (!bVar13) {
                bVar13 = false;
                goto LAB_0014f88c;
              }
              uVar14 = dmux->feature_flags_;
              PVar24 = PARSE_ERROR;
              if ((0xf < uVar22 && 0xf < uVar15) &&
                 (PVar24 = PARSE_NEED_MORE_DATA, 0xf < (dmux->mem_).end_ - sVar23)) {
                frame = (Frame *)WebPSafeCalloc(1,0x50);
                PVar24 = (uint)(frame == (Frame *)0x0) * 2;
              }
              bVar13 = true;
              if (PVar24 == PARSE_OK) {
                sVar23 = (dmux->mem_).start_;
                puVar10 = (dmux->mem_).buf_;
                bVar2 = puVar10[sVar23];
                bVar3 = puVar10[sVar23 + 1];
                bVar4 = puVar10[sVar23 + 2];
                (dmux->mem_).start_ = sVar23 + 3;
                frame->x_offset_ = (uint)bVar3 * 0x200 + (uint)bVar2 * 2 | (uint)bVar4 << 0x11;
                bVar2 = puVar10[sVar23 + 3];
                bVar3 = puVar10[sVar23 + 4];
                bVar4 = puVar10[sVar23 + 5];
                (dmux->mem_).start_ = sVar23 + 6;
                frame->y_offset_ = (uint)bVar3 * 0x200 + (uint)bVar2 * 2 | (uint)bVar4 << 0x11;
                uVar6 = *(ushort *)(puVar10 + sVar23 + 6);
                bVar2 = puVar10[sVar23 + 8];
                (dmux->mem_).start_ = sVar23 + 9;
                uVar19 = (uint)uVar6 + (uint)bVar2 * 0x10000 + 1;
                frame->width_ = uVar19;
                uVar6 = *(ushort *)(puVar10 + sVar23 + 9);
                bVar2 = puVar10[sVar23 + 0xb];
                (dmux->mem_).start_ = sVar23 + 0xc;
                uVar21 = (uint)uVar6 + (uint)bVar2 * 0x10000 + 1;
                frame->height_ = uVar21;
                uVar7 = *(undefined2 *)(puVar10 + sVar23 + 0xc);
                uVar5 = puVar10[sVar23 + 0xe];
                (dmux->mem_).start_ = sVar23 + 0xf;
                frame->duration_ = (uint)CONCAT12(uVar5,uVar7);
                bVar2 = puVar10[sVar23 + 0xf];
                (dmux->mem_).start_ = sVar23 + 0x10;
                frame->dispose_method_ = bVar2 & WEBP_MUX_DISPOSE_BACKGROUND;
                frame->blend_method_ = bVar2 >> 1 & WEBP_MUX_NO_BLEND;
                if ((int)((ulong)uVar19 * (ulong)uVar21 >> 0x20) == 0) {
                  PVar17 = StoreFrame(dmux->num_frames_ + 1,uVar15 - 0x10,&dmux->mem_,frame);
                  PVar24 = PARSE_ERROR;
                  if ((PVar17 != PARSE_ERROR) &&
                     (PVar24 = PVar17,
                     (ulong)(uVar15 - 0x10) < (dmux->mem_).start_ - (sVar23 + 0x10))) {
                    PVar24 = PARSE_ERROR;
                  }
                  bVar13 = true;
                  if (((PVar24 != PARSE_ERROR) && ((uVar14 & 2) != 0)) && (0 < frame->frame_num_)) {
                    pFVar12 = *dmux->frames_tail_;
                    if ((pFVar12 == (Frame *)0x0) || (pFVar12->complete_ != 0)) {
                      *dmux->frames_tail_ = frame;
                      frame->next_ = (Frame *)0x0;
                      dmux->frames_tail_ = &frame->next_;
                      dmux->num_frames_ = dmux->num_frames_ + 1;
                      bVar13 = false;
                    }
                    else {
                      PVar24 = PARSE_ERROR;
                    }
                  }
                  if (bVar13) {
                    WebPSafeFree(frame);
                  }
                }
                else {
                  WebPSafeFree(frame);
                  PVar24 = PARSE_ERROR;
                }
                bVar13 = true;
              }
            }
LAB_0014fb3c:
            sVar23 = (dmux->mem_).start_;
            iVar16 = 2;
            if (sVar23 != (dmux->mem_).riff_end_) {
              if ((dmux->mem_).end_ - sVar23 < 8) {
                PVar24 = PARSE_NEED_MORE_DATA;
              }
              iVar16 = 0;
            }
          }
          else {
            if (0x4d494e40 < iVar16) {
              if (iVar16 != 0x4d494e41) {
                iVar20 = 5;
                if (iVar16 == 0x50434349) goto LAB_0014facc;
                bVar26 = false;
                if (iVar16 != 0x58385056) goto LAB_0014fad6;
                goto LAB_0014f88c;
              }
              if (uVar15 < 6) goto LAB_0014f88c;
              PVar24 = PARSE_NEED_MORE_DATA;
              if ((dmux->mem_).end_ - sVar23 < uVar25) goto LAB_0014fb3c;
              bVar26 = true;
              if (bVar13) goto LAB_0014fad6;
              uVar8 = *(uint32_t *)(puVar10 + sVar9 + 8);
              (dmux->mem_).start_ = sVar9 + 0xc;
              dmux->bgcolor_ = uVar8;
              dmux->loop_count_ = (uint)*(ushort *)(puVar10 + sVar9 + 0xc);
              (dmux->mem_).start_ = sVar9 + (uVar15 - 6) + 0xe;
              bVar13 = true;
LAB_0014fb39:
              PVar24 = PARSE_OK;
              goto LAB_0014fb3c;
            }
            if ((iVar16 != 0x48504c41) && (bVar26 = false, iVar16 != 0x4c385056)) goto LAB_0014fad6;
LAB_0014fa95:
            if (bVar13) goto LAB_0014f88c;
            iVar16 = 1;
            PVar24 = PARSE_OK;
            if (uStack_34 == 0) {
              (dmux->mem_).start_ = sVar9;
              PVar24 = ParseSingleImage(dmux);
              bVar13 = false;
              goto LAB_0014fb3c;
            }
          }
        }
        else {
LAB_0014f88c:
          iVar16 = 1;
          PVar24 = PARSE_OK;
        }
LAB_0014f891:
        if (iVar16 != 0) {
          if (iVar16 == 2) {
            return PVar24;
          }
          return PARSE_ERROR;
        }
        if (PVar24 != PARSE_OK) {
          return PVar24;
        }
      } while( true );
    }
  }
  return PARSE_NEED_MORE_DATA;
}

Assistant:

static ParseStatus ParseVP8X(WebPDemuxer* const dmux) {
  MemBuffer* const mem = &dmux->mem_;
  uint32_t vp8x_size;

  if (MemDataSize(mem) < CHUNK_HEADER_SIZE) return PARSE_NEED_MORE_DATA;

  dmux->is_ext_format_ = 1;
  Skip(mem, TAG_SIZE);  // VP8X
  vp8x_size = ReadLE32(mem);
  if (vp8x_size > MAX_CHUNK_PAYLOAD) return PARSE_ERROR;
  if (vp8x_size < VP8X_CHUNK_SIZE) return PARSE_ERROR;
  vp8x_size += vp8x_size & 1;
  if (SizeIsInvalid(mem, vp8x_size)) return PARSE_ERROR;
  if (MemDataSize(mem) < vp8x_size) return PARSE_NEED_MORE_DATA;

  dmux->feature_flags_ = ReadByte(mem);
  Skip(mem, 3);  // Reserved.
  dmux->canvas_width_  = 1 + ReadLE24s(mem);
  dmux->canvas_height_ = 1 + ReadLE24s(mem);
  if (dmux->canvas_width_ * (uint64_t)dmux->canvas_height_ >= MAX_IMAGE_AREA) {
    return PARSE_ERROR;  // image final dimension is too large
  }
  Skip(mem, vp8x_size - VP8X_CHUNK_SIZE);  // skip any trailing data.
  dmux->state_ = WEBP_DEMUX_PARSED_HEADER;

  if (SizeIsInvalid(mem, CHUNK_HEADER_SIZE)) return PARSE_ERROR;
  if (MemDataSize(mem) < CHUNK_HEADER_SIZE) return PARSE_NEED_MORE_DATA;

  return ParseVP8XChunks(dmux);
}